

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O1

void demmt_memread2(mmt_read2 *r2,void *state)

{
  byte bVar1;
  uint8_t uVar2;
  void *w;
  cpu_mapping *pcVar3;
  uint64_t uVar4;
  mmt_read2 *__src;
  char *__format;
  ulong uVar5;
  uint32_t id;
  
  if (max_id == 0xffffffff) {
    id = 0;
    pcVar3 = (cpu_mapping *)0x0;
  }
  else {
    id = 0;
    do {
      pcVar3 = get_cpu_mapping(id);
      if (pcVar3 != (cpu_mapping *)0x0) {
        if ((pcVar3->cpu_addr <= r2->addr) && (r2->addr < pcVar3->cpu_addr + pcVar3->length)) break;
      }
      id = id + 1;
    } while (id < max_id + 1);
  }
  if (id != max_id + 1) {
    if (mem2_buffer == (void *)0x0) {
      mem2_buffer = malloc(0x1000);
    }
    w = mem2_buffer;
    *(uint8_t *)mem2_buffer = (r2->msg_type).type;
    *(uint32_t *)((long)w + 1) = id;
    *(int *)((long)w + 5) = (int)r2->addr - (int)pcVar3->cpu_addr;
    bVar1 = r2->len;
    *(byte *)((long)w + 9) = bVar1;
    __src = r2 + 1;
    memcpy((void *)((long)w + 10),__src,(ulong)bVar1);
    demmt_memread((mmt_read *)w,__src);
  }
  if (dump_memory_reads == 0) {
    return;
  }
  uVar2 = r2->len;
  switch(uVar2) {
  case '\x01':
    uVar4 = r2->addr;
    uVar5 = (ulong)r2[1].msg_type.type;
    __format = "@r 0x%lx, 0x%02x\n";
    break;
  case '\x02':
    uVar4 = r2->addr;
    uVar5 = (ulong)*(ushort *)(r2 + 1);
    __format = "@r 0x%lx, 0x%04x\n";
    break;
  case '\x03':
  case '\x05':
  case '\x06':
  case '\a':
switchD_0024fc81_caseD_3:
    fprintf(_stdout,"ERROR: unhandled size: %d\n");
    if (mmt_sync_fd != -1) {
      fflush(_stdout);
    }
    demmt_abort();
  case '\x04':
  case '\b':
    goto switchD_0024fc81_caseD_4;
  default:
    if ((uVar2 != '\x10') && (uVar2 != ' ')) goto switchD_0024fc81_caseD_3;
    goto switchD_0024fc81_caseD_4;
  }
  fprintf(_stdout,__format,uVar4,uVar5);
LAB_0024fd34:
  if (mmt_sync_fd == -1) {
    return;
  }
  fflush(_stdout);
  return;
switchD_0024fc81_caseD_4:
  fprintf(_stdout,"@r 0x%lx, ",r2->addr);
  if (r2->len != '\0') {
    uVar5 = 0;
    do {
      fprintf(_stdout,"0x%08x ",(ulong)*(uint *)(&r2[1].msg_type + uVar5));
      uVar5 = uVar5 + 4;
    } while (uVar5 < r2->len);
  }
  fprintf(_stdout,"%s\n","");
  goto LAB_0024fd34;
}

Assistant:

void demmt_memread2(struct mmt_read2 *r2, void *state)
{
	uint32_t i;
	struct cpu_mapping *m = NULL;
	for (i = 0; i < max_id + 1; ++i)
	{
		m = get_cpu_mapping(i);
		if (m && r2->addr >= m->cpu_addr && r2->addr < m->cpu_addr + m->length)
			break;
	}

	if (i != max_id + 1)
	{
		if (!mem2_buffer)
			mem2_buffer = malloc(4096);
		struct mmt_read *r1 = mem2_buffer;
		r1->msg_type = r2->msg_type;
		r1->id = i;
		r1->offset = r2->addr - m->cpu_addr;
		r1->len = r2->len;
		memcpy(r1->data, r2->data, r1->len);
		demmt_memread(r1, state);
	}

	if (dump_memory_reads)
	{
		unsigned char *data = &r2->data[0];
		if (r2->len == 1)
			mmt_printf("@r 0x%" PRIx64 ", 0x%02x\n", r2->addr, data[0]);
		else if (r2->len == 2)
			mmt_printf("@r 0x%" PRIx64 ", 0x%04x\n", r2->addr, *(uint16_t *)&data[0]);
		else if (r2->len == 4 || r2->len == 8 || r2->len == 16 || r2->len == 32)
		{
			mmt_printf("@r 0x%" PRIx64 ", ", r2->addr);
			int i;
			for (i = 0; i < r2->len; i += 4)
				mmt_printf("0x%08x ", *(uint32_t *)&data[i]);
			mmt_printf("%s\n", "");
		}
		else
		{
			mmt_error("unhandled size: %d\n", r2->len);
			demmt_abort();
		}
	}
}